

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CaseProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,std::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
          (BumpAllocator *this,Expression *args,
          span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *args_1,
          optional<slang::ast::RandSeqProductionSymbol::ProdItem> *args_2)

{
  span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> items;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> defaultItem;
  CaseProd *pCVar1;
  void *in_RCX;
  span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
  *in_stack_ffffffffffffff78;
  span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
  *in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  Expression *in_stack_ffffffffffffffb8;
  CaseProd *in_stack_ffffffffffffffc0;
  pointer local_38;
  
  pCVar1 = (CaseProd *)
           allocate(in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80,
                    (size_t)in_stack_ffffffffffffff78);
  std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>::
  span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  memcpy(&stack0xffffffffffffffa8,in_RCX,0x28);
  items._M_extent._M_extent_value = in_stack_ffffffffffffff90._M_extent_value;
  items._M_ptr = local_38;
  defaultItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _M_value.target = (RandSeqProductionSymbol *)in_stack_ffffffffffffffa8;
  defaultItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _0_8_ = pCVar1;
  defaultItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _M_value.args._M_ptr = (pointer)in_stack_ffffffffffffffb0;
  defaultItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_payload.
  _M_value.args._M_extent._M_extent_value =
       (__extent_storage<18446744073709551615UL>)
       (__extent_storage<18446744073709551615UL>)in_stack_ffffffffffffffb8;
  defaultItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._32_8_ =
       in_stack_ffffffffffffffc0;
  ast::RandSeqProductionSymbol::CaseProd::CaseProd
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,items,defaultItem);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }